

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::COMBICState::operator==(COMBICState *this,COMBICState *Value)

{
  KBOOL KVar1;
  COMBICState *Value_local;
  COMBICState *this_local;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui32TSC == Value->m_ui32TSC) {
    KVar1 = EntityType::operator!=(&this->m_MunSrc,&Value->m_MunSrc);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui32NumSrcs == Value->m_ui32NumSrcs) {
      if (this->m_ui16GeometryIndex == Value->m_ui16GeometryIndex) {
        if (this->m_ui32SrcType == Value->m_ui32SrcType) {
          if (((float)this->m_f32BarrageRate != (float)Value->m_f32BarrageRate) ||
             (NAN((float)this->m_f32BarrageRate) || NAN((float)Value->m_f32BarrageRate))) {
            this_local._7_1_ = false;
          }
          else if (((float)this->m_f32BarrageDuration != (float)Value->m_f32BarrageDuration) ||
                  (NAN((float)this->m_f32BarrageDuration) || NAN((float)Value->m_f32BarrageDuration)
                  )) {
            this_local._7_1_ = false;
          }
          else if (((float)this->m_f32BarrageCrosswindLength !=
                    (float)Value->m_f32BarrageCrosswindLength) ||
                  (NAN((float)this->m_f32BarrageCrosswindLength) ||
                   NAN((float)Value->m_f32BarrageCrosswindLength))) {
            this_local._7_1_ = false;
          }
          else if (((float)this->m_f32BarrageDownwindLength !=
                    (float)Value->m_f32BarrageDownwindLength) ||
                  (NAN((float)this->m_f32BarrageDownwindLength) ||
                   NAN((float)Value->m_f32BarrageDownwindLength))) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = EulerAngles::operator!=(&this->m_DetVel,&Value->m_DetVel);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              this_local._7_1_ = true;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL COMBICState::operator == ( const COMBICState & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )                          return false;
    if( m_ui32TSC                   != Value.m_ui32TSC )                   return false;
    if( m_MunSrc                    != Value.m_MunSrc )                    return false;
    if( m_ui32NumSrcs               != Value.m_ui32NumSrcs )               return false;
    if( m_ui16GeometryIndex         != Value.m_ui16GeometryIndex )         return false;
    if( m_ui32SrcType               != Value.m_ui32SrcType )               return false;
    if( m_f32BarrageRate            != Value.m_f32BarrageRate )            return false;
    if( m_f32BarrageDuration        != Value.m_f32BarrageDuration )        return false;
    if( m_f32BarrageCrosswindLength != Value.m_f32BarrageCrosswindLength ) return false;
    if( m_f32BarrageDownwindLength  != Value.m_f32BarrageDownwindLength )  return false;
    if( m_DetVel                    != Value.m_DetVel )                    return false;
    return true;
}